

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall CheaterBotStrategy::cheaterFortify(CheaterBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *pCVar3;
  pointer ppCVar4;
  pointer pcVar5;
  int *piVar6;
  Player *pPVar7;
  pointer ppCVar8;
  ostream *poVar9;
  PlayerState *pPVar10;
  bool bVar11;
  pointer ppCVar12;
  long *local_58;
  long local_50;
  long local_48 [2];
  CheaterBotStrategy *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are fortifying all their countries with enemy neighbours",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar12 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                  _M_impl.super__Vector_impl_data._M_start; local_38 = this, ppCVar12 != ppCVar2;
      ppCVar12 = ppCVar12 + 1) {
    pCVar3 = *ppCVar12;
    ppCVar8 = (pCVar3->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar4 = (pCVar3->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar4) {
      bVar11 = false;
      do {
        if (*(*ppCVar8)->pPlayerOwnerId != *pCVar3->pPlayerOwnerId) {
          bVar11 = true;
        }
        ppCVar8 = ppCVar8 + 1;
      } while (ppCVar8 != ppCVar4);
      if (bVar11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
        local_58 = local_48;
        pcVar5 = (pCVar3->cyName->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar5,pcVar5 + pCVar3->cyName->_M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_58,local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," had ",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pCVar3->pNumberOfTroops);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," armies. It now has ",0x14);
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        piVar6 = pCVar3->pNumberOfTroops;
        if (0 < *piVar6) {
          *piVar6 = *piVar6 * 2;
        }
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*piVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," armies. -",10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
    }
    this = local_38;
  }
  pPVar7 = (this->super_PlayerStrategy).player;
  pPVar10 = pPVar7->currentState;
  if (pPVar10 != (PlayerState *)0x0) {
    operator_delete(pPVar10,4);
  }
  pPVar10 = (PlayerState *)operator_new(4);
  *pPVar10 = IDLE;
  pPVar7->currentState = pPVar10;
  (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterFortify() {
    std::cout << "We have a cheater! They are fortifying all their countries with enemy neighbours" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        bool canFortify = false;
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                canFortify = true;
            }
        }
        if (canFortify) {
            std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
            //prevent overflow
            if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
                country->setNumberOfTroops(country->getNumberOfTroops() * 2);
            }
            std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}